

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<wchar_t> * __thiscall asl::Array<wchar_t>::reserve(Array<wchar_t> *this,int m)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  undefined8 *puVar4;
  wchar_t *__src;
  wchar_t wVar5;
  
  __src = this->_a;
  wVar2 = __src[-3];
  if (wVar2 < m) {
    wVar5 = wVar2 * 2;
    if (wVar2 * 2 <= m) {
      wVar5 = m;
    }
    wVar1 = __src[-4];
    if (((long)wVar2 & 0x3ffffffffffffe00U) == 0) {
      pwVar3 = (wchar_t *)malloc((long)wVar5 * 4 + 0x10);
      if (pwVar3 == (wchar_t *)0x0) goto LAB_00134278;
      if (wVar1 <= m) {
        m = wVar1;
      }
      memcpy(pwVar3 + 4,__src,(long)(m << 2));
      if (wVar5 == wVar2) {
        return this;
      }
      dup(this,(int)__src);
      wVar2 = this->_a[-2];
      free(this->_a + -4);
      this->_a = pwVar3 + 4;
    }
    else {
      dup(this,m);
      wVar2 = this->_a[-2];
      pwVar3 = (wchar_t *)realloc(this->_a + -4,(long)wVar5 * 4 + 0x10);
      if (pwVar3 == (wchar_t *)0x0) {
LAB_00134278:
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = dup2;
        __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      this->_a = pwVar3 + 4;
    }
    pwVar3[2] = wVar2;
    pwVar3[1] = wVar5;
    *pwVar3 = wVar1;
  }
  return this;
}

Assistant:

Array<T>& Array<T>::reserve(int m)
{
	int s=d().s;
	if (m <= s)
		return *this;
	int s1 = (m > s)? max(8*s/4, m) : s;
	T* b = _a;
	int n=d().n;
	if(s1 != s && s*sizeof(T) < 2048)
	{
		char* p = (char*) malloc( s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		int i = min(m,n), j = sizeof(T), k = i*j;
		memcpy((char*)b, _a, k);
	}
	else if(s1 != s)
	{
		dup();
		int   rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*) realloc( (char*)_a-sizeof(Data), s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
		s1 = s;
	}
	if(s1 != s)
	{
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*)_a - sizeof(Data);
		::free(p);
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
	}
	return *this;
}